

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O2

BreakpointProbe * __thiscall
Js::DebugDocument::SetBreakPoint
          (DebugDocument *this,StatementLocation statement,BREAKPOINT_STATE bps)

{
  ScriptContext *this_00;
  DebugManager *pDVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  ArenaAllocator *alloc;
  BreakpointProbe *pBVar5;
  DebugContext *pDVar6;
  BreakpointProbeList *pBVar7;
  undefined4 *puVar8;
  List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  UINT breakpointId;
  int i;
  long lVar9;
  BreakpointProbe *local_b8;
  BreakpointProbe *pProbe;
  BreakpointProbe *local_38;
  
  this_00 = (this->utf8SourceInfo->m_scriptContext).ptr;
  if ((this_00 != (ScriptContext *)0x0) &&
     (iVar4 = (*(this_00->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this_00),
     (char)iVar4 == '\0')) {
    if (BREAKPOINT_DISABLED < bps) {
      if (bps == BREAKPOINT_ENABLED) {
        alloc = ScriptContext::AllocatorForDiagnostics(this_00);
        pBVar5 = (BreakpointProbe *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
        pDVar1 = this_00->threadContext->debugManager;
        breakpointId = pDVar1->nextBreakPointId + 1;
        pDVar1->nextBreakPointId = breakpointId;
        BreakpointProbe::BreakpointProbe(pBVar5,this,&statement,breakpointId);
        local_b8 = pBVar5;
        pDVar6 = ScriptContext::GetDebugContext(this_00);
        ProbeContainer::AddProbe(pDVar6->diagProbesContainer,(Probe *)pBVar5);
        pBVar7 = GetBreakpointList(this);
        JsUtil::
        List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(pBVar7,&stack0xffffffffffffff48);
        return local_b8;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                  ,0x65,"(0)","Bad breakpoint state");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    pBVar7 = GetBreakpointList(this);
    if (pBVar7 != (BreakpointProbeList *)0x0) {
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                 &stack0xffffffffffffff48,L"TemporaryBreakpointList",
                 &this_00->threadContext->debugManager->diagnosticPageAllocator,Throw::OutOfMemory,
                 JsUtil::ExternalApi::RecoverUnusedMemory);
      this_01 = JsUtil::
                List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::New((ArenaAllocator *)&stack0xffffffffffffff48,4);
      for (lVar9 = 0;
          lVar9 < (pBVar7->
                  super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>
                  ).count; lVar9 = lVar9 + 1) {
        pBVar5 = (pBVar7->
                 super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>)
                 .buffer[lVar9];
        local_38 = pBVar5;
        bVar3 = BreakpointProbe::Matches(pBVar5,statement.function,statement.statement.begin);
        if (bVar3) {
          pDVar6 = ScriptContext::GetDebugContext(this_00);
          ProbeContainer::RemoveProbe(pDVar6->diagProbesContainer,&pBVar5->super_Probe);
          JsUtil::
          List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(this_01,&local_38);
        }
      }
      for (lVar9 = 0;
          lVar9 < (this_01->
                  super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>
                  ).count; lVar9 = lVar9 + 1) {
        local_38 = (this_01->
                   super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>
                   ).buffer[lVar9];
        JsUtil::
        List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Remove(pBVar7,&local_38);
      }
      (this_01->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
      count = 0;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
      ~ArenaAllocatorBase((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          &stack0xffffffffffffff48);
    }
  }
  return (BreakpointProbe *)0x0;
}

Assistant:

BreakpointProbe* DebugDocument::SetBreakPoint(StatementLocation statement, BREAKPOINT_STATE bps)
    {
        ScriptContext* scriptContext = this->utf8SourceInfo->GetScriptContext();

        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            return nullptr;
        }

        switch (bps)
        {
            default:
                AssertMsg(FALSE, "Bad breakpoint state");
                // Fall thru
            case BREAKPOINT_DISABLED:
            case BREAKPOINT_DELETED:
            {
                BreakpointProbeList* pBreakpointList = this->GetBreakpointList();
                if (pBreakpointList)
                {
                    ArenaAllocator arena(_u("TemporaryBreakpointList"), scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticPageAllocator(), Throw::OutOfMemory);
                    BreakpointProbeList* pDeleteList = this->NewBreakpointList(&arena);

                    pBreakpointList->Map([&statement, scriptContext, pDeleteList](int index, BreakpointProbe * breakpointProbe)
                    {
                        if (breakpointProbe->Matches(statement.function, statement.statement.begin))
                        {
                            scriptContext->GetDebugContext()->GetProbeContainer()->RemoveProbe(breakpointProbe);
                            pDeleteList->Add(breakpointProbe);
                        }
                    });

                    pDeleteList->Map([pBreakpointList](int index, BreakpointProbe * breakpointProbe)
                    {
                        pBreakpointList->Remove(breakpointProbe);
                    });
                    pDeleteList->Clear();
                }

                break;
            }
            case BREAKPOINT_ENABLED:
            {
                BreakpointProbe* pProbe = Anew(scriptContext->AllocatorForDiagnostics(), BreakpointProbe, this, statement,
                    scriptContext->GetThreadContext()->GetDebugManager()->GetNextBreakpointId());

                scriptContext->GetDebugContext()->GetProbeContainer()->AddProbe(pProbe);
                BreakpointProbeList* pBreakpointList = this->GetBreakpointList();
                pBreakpointList->Add(pProbe);
                return pProbe;
                break;
            }
        }
        return nullptr;
    }